

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS
ref_search_gather_tri
          (REF_SEARCH ref_search,REF_DBL *xyz,REF_INT parent,REF_DBL *position,REF_DBL *distance)

{
  uint uVar1;
  double dVar2;
  double local_70;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL element_dist;
  double dStack_48;
  REF_INT element;
  REF_DBL dist;
  REF_DBL *pRStack_38;
  REF_INT i;
  REF_DBL *distance_local;
  REF_DBL *position_local;
  REF_DBL *pRStack_20;
  REF_INT parent_local;
  REF_DBL *xyz_local;
  REF_SEARCH ref_search_local;
  
  if (ref_search->n == 0) {
    ref_search_local._4_4_ = 0;
  }
  else if (parent == -1) {
    ref_search_local._4_4_ = 0;
  }
  else {
    pRStack_38 = distance;
    distance_local = position;
    position_local._4_4_ = parent;
    pRStack_20 = xyz;
    xyz_local = (REF_DBL *)ref_search;
    if ((parent < 0) || (ref_search->n <= parent)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x118,"ref_search_gather_tri","parent invalid");
      printf("%d n %d parent\n",(ulong)*(uint *)((long)xyz_local + 4),(ulong)position_local._4_4_);
      ref_search_local._4_4_ = 1;
    }
    else if (ref_search->item[parent] == -1) {
      ref_search_local._4_4_ = 0;
    }
    else {
      dStack_48 = 0.0;
      for (dist._4_4_ = 0; dist._4_4_ < *(int *)xyz_local; dist._4_4_ = dist._4_4_ + 1) {
        dVar2 = pow(distance_local[dist._4_4_] -
                    *(double *)
                     ((long)xyz_local[5] +
                     (long)(int)(dist._4_4_ + *(int *)xyz_local * position_local._4_4_) * 8),2.0);
        dStack_48 = dVar2 + dStack_48;
      }
      dStack_48 = sqrt(dStack_48);
      if (dStack_48 - *(double *)((long)xyz_local[6] + (long)(int)position_local._4_4_ * 8) <=
          *pRStack_38) {
        element_dist._4_4_ = *(int *)((long)xyz_local[2] + (long)(int)position_local._4_4_ * 4);
        uVar1 = ref_search_distance3
                          (pRStack_20 + element_dist._4_4_ * 9,
                           pRStack_20 + (element_dist._4_4_ * 9 + 3),
                           pRStack_20 + (element_dist._4_4_ * 9 + 6),distance_local,
                           (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x127,"ref_search_gather_tri",(ulong)uVar1,"tri dist");
          return uVar1;
        }
        if (_ref_private_macro_code_rss_1 <= *pRStack_38) {
          local_70 = _ref_private_macro_code_rss_1;
        }
        else {
          local_70 = *pRStack_38;
        }
        *pRStack_38 = local_70;
      }
      if (dStack_48 - *(double *)((long)xyz_local[7] + (long)(int)position_local._4_4_ * 8) <=
          *pRStack_38) {
        uVar1 = ref_search_gather_tri
                          ((REF_SEARCH)xyz_local,pRStack_20,
                           *(REF_INT *)((long)xyz_local[3] + (long)(int)position_local._4_4_ * 4),
                           distance_local,pRStack_38);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x130,"ref_search_gather_tri",(ulong)uVar1,"gthr left");
          return uVar1;
        }
        uVar1 = ref_search_gather_tri
                          ((REF_SEARCH)xyz_local,pRStack_20,
                           *(REF_INT *)((long)xyz_local[4] + (long)(int)position_local._4_4_ * 4),
                           distance_local,pRStack_38);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x133,"ref_search_gather_tri",(ulong)uVar1,"gthr right");
          return uVar1;
        }
      }
      ref_search_local._4_4_ = 0;
    }
  }
  return ref_search_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_search_gather_tri(REF_SEARCH ref_search,
                                                REF_DBL *xyz, REF_INT parent,
                                                REF_DBL *position,
                                                REF_DBL *distance) {
  REF_INT i;
  REF_DBL dist;

  if (0 == ref_search->n) return REF_SUCCESS;  /* tree empty */
  if (REF_EMPTY == parent) return REF_SUCCESS; /* finished traversing */
  RAB(0 <= parent && parent < ref_search->n, "parent invalid",
      { printf("%d n %d parent\n", ref_search->n, parent); });
  /* finished traversing */
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  dist = 0.0;
  for (i = 0; i < ref_search->d; i++)
    dist += pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  dist = sqrt(dist);

  /* if the distance between me and the target are less than combined radii */
  if (dist - ref_search->radius[parent] <= *distance) {
    REF_INT element = ref_search->item[parent];
    REF_DBL element_dist;
    RSS(ref_search_distance3(&(xyz[0 + 9 * element]), &(xyz[3 + 9 * element]),
                             &(xyz[6 + 9 * element]), position, &element_dist),
        "tri dist");
    *distance = MIN(*distance, element_dist);
  }

  /* if the distance between me and the target are less than children
   * children_ball includes child radii, so only subtract target radius */
  if (*distance >= dist - ref_search->children_ball[parent]) {
    RSS(ref_search_gather_tri(ref_search, xyz, ref_search->left[parent],
                              position, distance),
        "gthr left");
    RSS(ref_search_gather_tri(ref_search, xyz, ref_search->right[parent],
                              position, distance),
        "gthr right");
  }

  return REF_SUCCESS;
}